

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

rcode __thiscall
olc::Platform_Linux::CreateGraphics
          (Platform_Linux *this,bool bFullScreen,bool bEnableVSYNC,vi2d *vViewPos,vi2d *vViewSize)

{
  long *plVar1;
  int iVar2;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  initializer_list<void_*> __l;
  allocator_type local_61;
  vector<void_*,_std::allocator<void_*>_> local_60;
  Display *local_48;
  Window *local_40;
  XVisualInfo *local_38;
  
  plVar1 = renderer;
  local_48 = this->olc_Display;
  local_40 = &this->olc_Window;
  local_38 = this->olc_VisualInfo;
  __l._M_len = 3;
  __l._M_array = &local_48;
  std::vector<void_*,_std::allocator<void_*>_>::vector(&local_60,__l,&local_61);
  iVar2 = (**(code **)(*plVar1 + 0x18))
                    (plVar1,&local_60,CONCAT71(in_register_00000031,bFullScreen) & 0xffffffff,
                     CONCAT71(in_register_00000011,bEnableVSYNC) & 0xffffffff);
  if (local_60.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar2 == 1) {
    (**(code **)(*renderer + 0x78))(renderer,vViewPos,vViewSize);
  }
  return (uint)(iVar2 == 1);
}

Assistant:

virtual olc::rcode CreateGraphics(bool bFullScreen, bool bEnableVSYNC, const olc::vi2d &vViewPos, const olc::vi2d &vViewSize) override
		{
			if (renderer->CreateDevice({olc_Display, &olc_Window, olc_VisualInfo}, bFullScreen, bEnableVSYNC) == olc::rcode::OK)
			{
				renderer->UpdateViewport(vViewPos, vViewSize);
				return olc::rcode::OK;
			}
			else
				return olc::rcode::FAIL;
		}